

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EnvironmentVarData.cpp
# Opt level: O0

string * __thiscall
license::locate::EnvironmentVarData::retrieve_license_content
          (string *__return_storage_ptr__,EnvironmentVarData *this,string *licenseLocation)

{
  char *pcVar1;
  uchar *puVar2;
  allocator local_72;
  undefined1 local_71;
  undefined1 local_70 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  int flen;
  allocator local_41;
  undefined1 local_40 [8];
  string env_val;
  string *licenseLocation_local;
  EnvironmentVarData *this_local;
  string *str;
  
  env_val.field_2._8_8_ = licenseLocation;
  pcVar1 = getenv("LICENSE_LOCATION");
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_40,pcVar1,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  if ((this->isBase64 & 1U) == 0) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)local_40);
  }
  else {
    data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    unbase64((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70,(string *)local_40);
    local_71 = 0;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)__return_storage_ptr__,(char *)puVar2,&local_72);
    std::allocator<char>::~allocator((allocator<char> *)&local_72);
    local_71 = 1;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_70);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

const std::string EnvironmentVarData::retrieve_license_content(const std::string &licenseLocation) const {
	string env_val = getenv(LCC_LICENSE_LOCATION_ENV_VAR);
	if (isBase64) {
		int flen = 0;
		vector<uint8_t> data = unbase64(env_val);
		string str = string(reinterpret_cast<char *>(data.data()));
		return str;
	}
	return env_val;
}